

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O1

int __thiscall ncnn::BatchNorm::load_model(BatchNorm *this,ModelBin *mb)

{
  Mat *pMVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  float fVar14;
  void *local_78;
  int *piStack_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int local_40;
  size_t local_38;
  
  (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->channels,1);
  pMVar1 = &this->slope_data;
  if (pMVar1 != (Mat *)&local_78) {
    if (piStack_70 != (int *)0x0) {
      LOCK();
      *piStack_70 = *piStack_70 + 1;
      UNLOCK();
    }
    piVar3 = (this->slope_data).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->slope_data).data;
        pAVar5 = (this->slope_data).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->slope_data).cstep = 0;
    *(undefined8 *)((long)&(this->slope_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->slope_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->slope_data).refcount = (int *)0x0;
    (this->slope_data).dims = 0;
    (this->slope_data).w = 0;
    (this->slope_data).h = 0;
    (this->slope_data).d = 0;
    (this->slope_data).c = 0;
    (this->slope_data).data = local_78;
    (this->slope_data).refcount = piStack_70;
    (this->slope_data).elemsize = local_68;
    (this->slope_data).elempack = local_60;
    (this->slope_data).allocator = local_58;
    (this->slope_data).dims = local_50;
    (this->slope_data).w = iStack_4c;
    (this->slope_data).h = iStack_48;
    (this->slope_data).d = iStack_44;
    (this->slope_data).c = local_40;
    (this->slope_data).cstep = local_38;
  }
  if (piStack_70 != (int *)0x0) {
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if (*piStack_70 == 0) {
      if (local_58 == (Allocator *)0x0) {
        if (local_78 != (void *)0x0) {
          free(local_78);
        }
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  iVar12 = -100;
  if ((pMVar1->data != (void *)0x0) && ((long)(this->slope_data).c * (this->slope_data).cstep != 0))
  {
    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->channels,1);
    pMVar1 = &this->mean_data;
    if (pMVar1 != (Mat *)&local_78) {
      if (piStack_70 != (int *)0x0) {
        LOCK();
        *piStack_70 = *piStack_70 + 1;
        UNLOCK();
      }
      piVar3 = (this->mean_data).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->mean_data).data;
          pAVar5 = (this->mean_data).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->mean_data).cstep = 0;
      *(undefined8 *)((long)&(this->mean_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->mean_data).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->mean_data).refcount = (int *)0x0;
      (this->mean_data).dims = 0;
      (this->mean_data).w = 0;
      (this->mean_data).h = 0;
      (this->mean_data).d = 0;
      (this->mean_data).c = 0;
      (this->mean_data).data = local_78;
      (this->mean_data).refcount = piStack_70;
      (this->mean_data).elemsize = local_68;
      (this->mean_data).elempack = local_60;
      (this->mean_data).allocator = local_58;
      (this->mean_data).dims = local_50;
      (this->mean_data).w = iStack_4c;
      (this->mean_data).h = iStack_48;
      (this->mean_data).d = iStack_44;
      (this->mean_data).c = local_40;
      (this->mean_data).cstep = local_38;
    }
    if (piStack_70 != (int *)0x0) {
      LOCK();
      *piStack_70 = *piStack_70 + -1;
      UNLOCK();
      if (*piStack_70 == 0) {
        if (local_58 == (Allocator *)0x0) {
          if (local_78 != (void *)0x0) {
            free(local_78);
          }
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
    if ((pMVar1->data != (void *)0x0) && ((long)(this->mean_data).c * (this->mean_data).cstep != 0))
    {
      (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->channels,1);
      pMVar1 = &this->var_data;
      if (pMVar1 != (Mat *)&local_78) {
        if (piStack_70 != (int *)0x0) {
          LOCK();
          *piStack_70 = *piStack_70 + 1;
          UNLOCK();
        }
        piVar3 = (this->var_data).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar4 = (this->var_data).data;
            pAVar5 = (this->var_data).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->var_data).cstep = 0;
        *(undefined8 *)((long)&(this->var_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->var_data).elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->var_data).refcount = (int *)0x0;
        (this->var_data).dims = 0;
        (this->var_data).w = 0;
        (this->var_data).h = 0;
        (this->var_data).d = 0;
        (this->var_data).c = 0;
        (this->var_data).data = local_78;
        (this->var_data).refcount = piStack_70;
        (this->var_data).elemsize = local_68;
        (this->var_data).elempack = local_60;
        (this->var_data).allocator = local_58;
        (this->var_data).dims = local_50;
        (this->var_data).w = iStack_4c;
        (this->var_data).h = iStack_48;
        (this->var_data).d = iStack_44;
        (this->var_data).c = local_40;
        (this->var_data).cstep = local_38;
      }
      if (piStack_70 != (int *)0x0) {
        LOCK();
        *piStack_70 = *piStack_70 + -1;
        UNLOCK();
        if (*piStack_70 == 0) {
          if (local_58 == (Allocator *)0x0) {
            if (local_78 != (void *)0x0) {
              free(local_78);
            }
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
      if ((pMVar1->data != (void *)0x0) && ((long)(this->var_data).c * (this->var_data).cstep != 0))
      {
        (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->channels);
        pMVar1 = &this->bias_data;
        if (pMVar1 != (Mat *)&local_78) {
          if (piStack_70 != (int *)0x0) {
            LOCK();
            *piStack_70 = *piStack_70 + 1;
            UNLOCK();
          }
          piVar3 = (this->bias_data).refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = (this->bias_data).data;
              pAVar5 = (this->bias_data).allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])();
              }
            }
          }
          (this->bias_data).cstep = 0;
          *(undefined8 *)((long)&(this->bias_data).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->bias_data).elemsize + 4) = 0;
          pMVar1->data = (void *)0x0;
          (this->bias_data).refcount = (int *)0x0;
          (this->bias_data).dims = 0;
          (this->bias_data).w = 0;
          (this->bias_data).h = 0;
          (this->bias_data).d = 0;
          (this->bias_data).c = 0;
          (this->bias_data).data = local_78;
          (this->bias_data).refcount = piStack_70;
          (this->bias_data).elemsize = local_68;
          (this->bias_data).elempack = local_60;
          (this->bias_data).allocator = local_58;
          (this->bias_data).dims = local_50;
          (this->bias_data).w = iStack_4c;
          (this->bias_data).h = iStack_48;
          (this->bias_data).d = iStack_44;
          (this->bias_data).c = local_40;
          (this->bias_data).cstep = local_38;
        }
        if (piStack_70 != (int *)0x0) {
          LOCK();
          *piStack_70 = *piStack_70 + -1;
          UNLOCK();
          if (*piStack_70 == 0) {
            if (local_58 == (Allocator *)0x0) {
              if (local_78 != (void *)0x0) {
                free(local_78);
              }
            }
            else {
              (*local_58->_vptr_Allocator[3])();
            }
          }
        }
        if ((((pMVar1->data != (void *)0x0) &&
             ((long)(this->bias_data).c * (this->bias_data).cstep != 0)) &&
            (Mat::create(&this->a_data,this->channels,4,(Allocator *)0x0),
            (this->a_data).data != (void *)0x0)) &&
           ((long)(this->a_data).c * (this->a_data).cstep != 0)) {
          Mat::create(&this->b_data,this->channels,4,(Allocator *)0x0);
          pvVar4 = (this->b_data).data;
          if ((pvVar4 != (void *)0x0) && ((long)(this->b_data).c * (this->b_data).cstep != 0)) {
            iVar2 = this->channels;
            if ((long)iVar2 < 1) {
              iVar12 = 0;
            }
            else {
              pvVar6 = (this->var_data).data;
              pvVar7 = (this->bias_data).data;
              pvVar8 = (this->slope_data).data;
              pvVar9 = (this->mean_data).data;
              pvVar10 = (this->a_data).data;
              iVar12 = 0;
              lVar11 = 0;
              do {
                fVar14 = SQRT(this->eps + *(float *)((long)pvVar6 + lVar11 * 4));
                uVar13 = -(uint)(fVar14 == 0.0);
                fVar14 = 1.0 / (float)(uVar13 & 0x38d1b717 | ~uVar13 & (uint)fVar14);
                *(float *)((long)pvVar10 + lVar11 * 4) =
                     *(float *)((long)pvVar7 + lVar11 * 4) -
                     *(float *)((long)pvVar9 + lVar11 * 4) * *(float *)((long)pvVar8 + lVar11 * 4) *
                     fVar14;
                *(float *)((long)pvVar4 + lVar11 * 4) =
                     fVar14 * *(float *)((long)pvVar8 + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (iVar2 != lVar11);
            }
          }
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int BatchNorm::load_model(const ModelBin& mb)
{
    slope_data = mb.load(channels, 1);
    if (slope_data.empty())
        return -100;

    mean_data = mb.load(channels, 1);
    if (mean_data.empty())
        return -100;

    var_data = mb.load(channels, 1);
    if (var_data.empty())
        return -100;

    bias_data = mb.load(channels, 1);
    if (bias_data.empty())
        return -100;

    a_data.create(channels);
    if (a_data.empty())
        return -100;
    b_data.create(channels);
    if (b_data.empty())
        return -100;

    for (int i = 0; i < channels; i++)
    {
        float sqrt_var = static_cast<float>(sqrt(var_data[i] + eps));
        if (sqrt_var == 0.f)
            sqrt_var = 0.0001f; // sanitize divide by zero
        a_data[i] = bias_data[i] - slope_data[i] * mean_data[i] / sqrt_var;
        b_data[i] = slope_data[i] / sqrt_var;
    }

    return 0;
}